

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O1

bool __thiscall QHttpMultiPartIODevice::reset(QHttpMultiPartIODevice *this)

{
  int *piVar1;
  QHttpPartPrivate *pQVar2;
  ulong uVar3;
  char cVar4;
  pointer pQVar5;
  QHttpMultiPartPrivate *pQVar6;
  ulong uVar7;
  QSharedDataPointer<QHttpPartPrivate> *this_00;
  long lVar8;
  bool bVar9;
  
  QIODevice::reset();
  pQVar6 = this->multiPart;
  bVar9 = (pQVar6->parts).d.size == 0;
  if (!bVar9) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      pQVar5 = QList<QHttpPart>::data(&pQVar6->parts);
      piVar1 = *(int **)((long)&(pQVar5->d).d.ptr + lVar8);
      this_00 = (QSharedDataPointer<QHttpPartPrivate> *)((long)&(pQVar5->d).d.ptr + lVar8);
      if ((piVar1 != (int *)0x0) && (*piVar1 != 1)) {
        QSharedDataPointer<QHttpPartPrivate>::detach_helper(this_00);
      }
      pQVar2 = (this_00->d).ptr;
      if (pQVar2->bodyDevice == (QIODevice *)0x0) {
        pQVar2->readPointer = 0;
      }
      else {
        cVar4 = (**(code **)(*(long *)pQVar2->bodyDevice + 0x98))();
        pQVar2->readPointer = 0;
        if (cVar4 == '\0') {
          if (bVar9 == false) {
            return false;
          }
          break;
        }
      }
      uVar7 = uVar7 + 1;
      pQVar6 = this->multiPart;
      lVar8 = lVar8 + 8;
      uVar3 = (pQVar6->parts).d.size;
      bVar9 = uVar3 <= uVar7;
    } while (uVar7 < uVar3);
  }
  this->readPointer = 0;
  return bVar9;
}

Assistant:

bool QHttpMultiPartIODevice::reset()
{
    // Reset QIODevice's data
    QIODevice::reset();
    for (int a = 0; a < multiPart->parts.size(); a++)
        if (!multiPart->parts[a].d->reset())
            return false;
    readPointer = 0;
    return true;
}